

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gif.h
# Opt level: O0

void GifWriteBit(GifBitStatus *stat,uint32_t bit)

{
  uint uVar1;
  uint32_t bit_local;
  GifBitStatus *stat_local;
  
  stat->byte = stat->byte | (byte)((bit & 1) << (stat->bitIndex & 0x1f));
  stat->bitIndex = stat->bitIndex + '\x01';
  if (7 < stat->bitIndex) {
    uVar1 = stat->chunkIndex;
    stat->chunkIndex = uVar1 + 1;
    stat->chunk[uVar1] = stat->byte;
    stat->bitIndex = '\0';
    stat->byte = '\0';
  }
  return;
}

Assistant:

void GifWriteBit( GifBitStatus& stat, uint32_t bit )
{
    bit = bit & 1;
    bit = bit << stat.bitIndex;
    stat.byte |= bit;

    ++stat.bitIndex;
    if( stat.bitIndex > 7 )
    {
        // move the newly-finished byte to the chunk buffer
        stat.chunk[stat.chunkIndex++] = stat.byte;
        // and start a new byte
        stat.bitIndex = 0;
        stat.byte = 0;
    }
}